

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

void player_init(player *p)

{
  bool bVar1;
  object_kind *poVar2;
  _Bool _Var3;
  monster_race *race_00;
  monster_lore_conflict *pmVar4;
  player_upkeep *ppVar5;
  object **ppoVar6;
  int16_t *piVar7;
  object *poVar8;
  _Bool *p_Var9;
  curse_data *pcVar10;
  player_shape *ppVar11;
  monster_lore *lore;
  monster_race *race;
  object_kind *kind;
  player_options opts_save;
  wchar_t i;
  player *p_local;
  
  unique0x10000351 = p;
  memcpy((void *)((long)&kind + 4),&p->opts,0x30);
  player_cleanup_members(stack0xfffffffffffffff0);
  memset(stack0xfffffffffffffff0,0,0x4c8);
  opts_save.opt[0x28] = false;
  opts_save.opt[0x29] = false;
  opts_save.opt[0x2a] = false;
  opts_save.opt[0x2b] = false;
  while( true ) {
    bVar1 = false;
    if (z_info != (angband_constants *)0x0) {
      bVar1 = (int)opts_save.opt._40_4_ < (int)(uint)z_info->a_max;
    }
    if (!bVar1) break;
    mark_artifact_created(a_info + (int)opts_save.opt._40_4_,false);
    mark_artifact_seen(a_info + (int)opts_save.opt._40_4_,false);
    opts_save.opt._40_4_ = opts_save.opt._40_4_ + 1;
  }
  quests_reset();
  opts_save.opt[0x28] = true;
  opts_save.opt[0x29] = false;
  opts_save.opt[0x2a] = false;
  opts_save.opt[0x2b] = false;
  while( true ) {
    poVar2 = k_info;
    bVar1 = false;
    if (z_info != (angband_constants *)0x0) {
      bVar1 = (int)opts_save.opt._40_4_ < (int)(uint)z_info->k_max;
    }
    if (!bVar1) break;
    k_info[(int)opts_save.opt._40_4_].tried = false;
    poVar2[(int)opts_save.opt._40_4_].aware = false;
    opts_save.opt._40_4_ = opts_save.opt._40_4_ + 1;
  }
  opts_save.opt[0x28] = true;
  opts_save.opt[0x29] = false;
  opts_save.opt[0x2a] = false;
  opts_save.opt[0x2b] = false;
  while( true ) {
    bVar1 = false;
    if (z_info != (angband_constants *)0x0) {
      bVar1 = (int)opts_save.opt._40_4_ < (int)(uint)z_info->r_max;
    }
    if (!bVar1) break;
    race_00 = r_info + (int)opts_save.opt._40_4_;
    pmVar4 = get_lore(race_00);
    race_00->cur_num = L'\0';
    race_00->max_num = 'd';
    _Var3 = flag_has_dbg(race_00->flags,0xc,1,"race->flags","RF_UNIQUE");
    if (_Var3) {
      race_00->max_num = '\x01';
    }
    pmVar4->pkills = 0;
    pmVar4->thefts = 0;
    opts_save.opt._40_4_ = opts_save.opt._40_4_ + 1;
  }
  ppVar5 = (player_upkeep *)mem_zalloc(0x98);
  stack0xfffffffffffffff0->upkeep = ppVar5;
  ppoVar6 = (object **)mem_zalloc((long)(int)(z_info->pack_size + 1) << 3);
  stack0xfffffffffffffff0->upkeep->inven = ppoVar6;
  ppoVar6 = (object **)mem_zalloc((ulong)z_info->quiver_size << 3);
  stack0xfffffffffffffff0->upkeep->quiver = ppoVar6;
  piVar7 = (int16_t *)mem_zalloc(0x6a);
  stack0xfffffffffffffff0->timed = piVar7;
  poVar8 = (object *)mem_zalloc(0x148);
  stack0xfffffffffffffff0->obj_k = poVar8;
  p_Var9 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
  stack0xfffffffffffffff0->obj_k->brands = p_Var9;
  p_Var9 = (_Bool *)mem_zalloc((ulong)z_info->slay_max);
  stack0xfffffffffffffff0->obj_k->slays = p_Var9;
  pcVar10 = (curse_data *)mem_zalloc((ulong)z_info->curse_max << 3);
  stack0xfffffffffffffff0->obj_k->curses = pcVar10;
  memcpy(&stack0xfffffffffffffff0->opts,(void *)((long)&kind + 4),0x30);
  turn = 1;
  stack0xfffffffffffffff0->total_energy = 0;
  stack0xfffffffffffffff0->resting_turn = 0;
  stack0xfffffffffffffff0->race = races;
  stack0xfffffffffffffff0->class = classes;
  ppVar11 = lookup_player_shape("normal");
  stack0xfffffffffffffff0->shape = ppVar11;
  return;
}

Assistant:

void player_init(struct player *p)
{
	int i;
	struct player_options opts_save = p->opts;

	player_cleanup_members(p);

	/* Wipe the player */
	memset(p, 0, sizeof(struct player));

	/* Start with no artifacts made yet */
	for (i = 0; z_info && i < z_info->a_max; i++) {
		mark_artifact_created(&a_info[i], false);
		mark_artifact_seen(&a_info[i], false);
	}

	/* Start with no quests completed */
	quests_reset();

	for (i = 1; z_info && i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];
		kind->tried = false;
		kind->aware = false;
	}

	for (i = 1; z_info && i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		struct monster_lore *lore = get_lore(race);
		race->cur_num = 0;
		race->max_num = 100;
		if (rf_has(race->flags, RF_UNIQUE))
			race->max_num = 1;
		lore->pkills = 0;
		lore->thefts = 0;
	}

	p->upkeep = mem_zalloc(sizeof(struct player_upkeep));
	p->upkeep->inven = mem_zalloc((z_info->pack_size + 1) *
								  sizeof(struct object *));
	p->upkeep->quiver = mem_zalloc(z_info->quiver_size *
								   sizeof(struct object *));
	p->timed = mem_zalloc(TMD_MAX * sizeof(int16_t));
	p->obj_k = mem_zalloc(sizeof(struct object));
	p->obj_k->brands = mem_zalloc(z_info->brand_max * sizeof(bool));
	p->obj_k->slays = mem_zalloc(z_info->slay_max * sizeof(bool));
	p->obj_k->curses = mem_zalloc(z_info->curse_max *
								  sizeof(struct curse_data));

	/* Options should persist */
	p->opts = opts_save;

	/* First turn. */
	turn = 1;
	p->total_energy = 0;
	p->resting_turn = 0;

	/* Default to the first race/class in the edit file */
	p->race = races;
	p->class = classes;

	/* Player starts unshapechanged */
	p->shape = lookup_player_shape("normal");
}